

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O1

void __thiscall
TCLAP::ValueArg<unsigned_long>::ValueArg
          (ValueArg<unsigned_long> *this,string *flag,string *name,string *desc,bool req,
          unsigned_long val,string *typeDesc,Visitor *v)

{
  pointer pcVar1;
  
  Arg::Arg(&this->super_Arg,flag,name,desc,req,true,v);
  (this->super_Arg)._vptr_Arg = (_func_int **)&PTR__ValueArg_00150760;
  this->_value = val;
  this->_default = val;
  (this->_typeDesc)._M_dataplus._M_p = (pointer)&(this->_typeDesc).field_2;
  pcVar1 = (typeDesc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_typeDesc,pcVar1,pcVar1 + typeDesc->_M_string_length);
  this->_constraint = (Constraint<unsigned_long> *)0x0;
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ }